

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

void ghc::filesystem::current_path(path *p,error_code *ec)

{
  int iVar1;
  char *__path;
  undefined8 *in_RSI;
  error_code eVar2;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  path *in_stack_ffffffffffffffc8;
  string local_30 [32];
  undefined8 *local_10;
  
  local_10 = in_RSI;
  std::error_code::clear
            ((error_code *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  path::string_abi_cxx11_(in_stack_ffffffffffffffc8);
  __path = (char *)std::__cxx11::string::c_str();
  iVar1 = chdir(__path);
  std::__cxx11::string::~string(local_30);
  if (iVar1 == -1) {
    eVar2 = detail::make_system_error(in_stack_ffffffffffffffc4);
    *local_10 = CONCAT44(in_stack_ffffffffffffffc4,eVar2._M_value);
    local_10[1] = eVar2._M_cat;
  }
  return;
}

Assistant:

GHC_INLINE void current_path(const path& p, std::error_code& ec) noexcept
{
    ec.clear();
#ifdef GHC_OS_WINDOWS
    if (!::SetCurrentDirectoryW(GHC_NATIVEWP(p))) {
        ec = detail::make_system_error();
    }
#else
    if (::chdir(p.string().c_str()) == -1) {
        ec = detail::make_system_error();
    }
#endif
}